

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall
QLocale::toString(QLocale *this,qulonglong number,int fieldWidth,char32_t fillChar)

{
  QStringView text;
  int iVar1;
  uint uVar2;
  qsizetype qVar3;
  QString *this_00;
  int in_ECX;
  undefined8 in_RSI;
  QLocaleData *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  uint in_stack_00000030;
  qsizetype padding;
  uint flags;
  int width;
  int absFieldWidth;
  QString *result;
  QString filler;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  char32_t in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  QString *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff60;
  int iVar4;
  QLocaleData *fieldWidth_00;
  char32_t fillChar_00;
  qulonglong in_stack_ffffffffffffff80;
  QLocaleData *in_stack_ffffffffffffff88;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  fieldWidth_00 = in_RDI;
  local_c = in_ECX;
  iVar1 = qAbs<int>(&local_c);
  iVar4 = iVar1;
  if (in_R8D != 0x30) {
    iVar4 = -1;
  }
  uVar2 = calculateFlags(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,
                         (QLocale *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  *(undefined1 **)&in_RDI->m_decimalSeparator_idx = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->m_midListPattern_idx = &DAT_aaaaaaaaaaaaaaaa;
  QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x4cd4c5);
  QLocaleData::unsLongLongToString
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,(int)((ulong)in_RSI >> 0x20),
             (int)in_RSI,(int)((ulong)fieldWidth_00 >> 0x20),in_stack_00000030);
  fillChar_00 = (char32_t)((ulong)in_RSI >> 0x20);
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  text.m_size._4_4_ = iVar4;
  text.m_size._0_4_ = in_stack_ffffffffffffff60;
  text.m_data = (storage_type_conflict *)in_RDI;
  qVar3 = stringWidth(text);
  this_00 = (QString *)(iVar1 - qVar3);
  if (0 < (long)this_00) {
    QSharedDataPointer<QLocalePrivate>::operator->((QSharedDataPointer<QLocalePrivate> *)0x4cd599);
    calculateFiller(in_stack_ffffffffffffff80,fillChar_00,(qsizetype)fieldWidth_00,in_RDI);
    if (local_c < 0) {
      QString::append(this_00,(QString *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    }
    else {
      QString::prepend((QString *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                       (QString *)CONCAT44(in_stack_ffffffffffffff2c,uVar2));
    }
    QString::~QString((QString *)0x4cd631);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)fieldWidth_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::toString(qulonglong number, int fieldWidth, char32_t fillChar) const
{
    int absFieldWidth = qAbs(fieldWidth);
    int width = (fillChar == U'0') ? absFieldWidth : -1;
    unsigned flags = calculateFlags(fieldWidth, fillChar, *this);

    QString result = d->m_data->unsLongLongToString(number, -1, 10, width, flags);
    qsizetype padding = absFieldWidth - stringWidth(result);

    if (padding > 0) {
        QString filler = calculateFiller(padding, fillChar, fieldWidth, d->m_data);
        if (fieldWidth < 0)
            result.append(filler);
        else
            result.prepend(filler);
    }
    return result;
}